

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp_writer.c
# Opt level: O0

void CP_PeerFailCloseWSReader(WS_ReaderInfo CP_WSR_Stream,StreamStatus NewState)

{
  int iVar1;
  undefined8 uVar2;
  uint in_ESI;
  long *in_RDI;
  SstStream unaff_retaddr;
  int i;
  SstStream ParentStream;
  int local_1c;
  SstStream s;
  undefined4 in_stack_fffffffffffffff0;
  
  s = (SstStream)*in_RDI;
  if (s->Status == Established) {
    if (*(uint *)(in_RDI + 1) == in_ESI) {
      CP_verbose(s,TraceVerbose,"In PeerFailCloseWSReader, but status is already set% d\n",
                 (ulong)s->Status);
    }
    else {
      *(uint *)(in_RDI + 1) = in_ESI;
      pthread_cond_signal((pthread_cond_t *)&s->DataCondition);
      if (((in_ESI == 3) || (in_ESI == 5)) || (in_ESI == 4)) {
        CP_verbose(s,PerRankVerbose,"In PeerFailCloseWSReader, releasing sent timesteps\n");
        DerefAllSentTimesteps
                  ((SstStream)CONCAT44(in_ESI,in_stack_fffffffffffffff0),(WS_ReaderInfo)s);
        in_RDI[0xb] = in_RDI[4] + 1;
        for (local_1c = 0; local_1c < (int)in_RDI[0xf]; local_1c = local_1c + 1) {
          if (*(long *)(in_RDI[0x11] + (long)local_1c * 0x18 + 0x10) != 0) {
            CMConnection_dereference(*(undefined8 *)(in_RDI[0x11] + (long)local_1c * 0x18 + 0x10));
            *(undefined8 *)(in_RDI[0x11] + (long)local_1c * 0x18 + 0x10) = 0;
          }
        }
        if (in_ESI == 4) {
          uVar2 = CMadd_delayed_task(s->CPInfo->SharedCM->cm,2,0,CloseWSRStream,in_RDI);
          CMfree(uVar2);
        }
        else {
          iVar1 = strncmp("mpi",s->ConfigParams->DataTransport,3);
          if ((iVar1 == 0) && (in_RDI[0xe] != 0)) {
            (**(code **)(*(long *)(*in_RDI + 0xb0) + 0xa8))(&Svcs,in_RDI[0xe]);
            in_RDI[0xe] = 0;
          }
        }
      }
      CP_verbose(s,PerStepVerbose,"Moving Reader stream %p to status %s\n",in_RDI,
                 SSTStreamStatusStr[in_ESI]);
      QueueMaintenance(unaff_retaddr);
    }
  }
  else {
    CP_verbose(s,TraceVerbose,"In PeerFailCloseWSReader, but Parent status not Established, %d\n",
               (ulong)s->Status);
  }
  return;
}

Assistant:

static void CP_PeerFailCloseWSReader(WS_ReaderInfo CP_WSR_Stream, enum StreamStatus NewState)
{
    SstStream ParentStream = CP_WSR_Stream->ParentStream;
    STREAM_ASSERT_LOCKED(ParentStream);
    if (ParentStream->Status != Established)
    {
        CP_verbose(ParentStream, TraceVerbose,
                   "In PeerFailCloseWSReader, but Parent status not Established, %d\n",
                   ParentStream->Status);
        return;
    }

    if (CP_WSR_Stream->ReaderStatus == NewState)
    {
        CP_verbose(ParentStream, TraceVerbose,
                   "In PeerFailCloseWSReader, but status is already set% d\n",
                   ParentStream->Status);
        return;
    }

    CP_WSR_Stream->ReaderStatus = NewState;
    STREAM_CONDITION_SIGNAL(ParentStream);

    if ((NewState == PeerClosed) || (NewState == Closed) || (NewState == PeerFailed))
    {
        // enter this on fail or deliberate close
        CP_verbose(ParentStream, PerRankVerbose,
                   "In PeerFailCloseWSReader, releasing sent timesteps\n");
        DerefAllSentTimesteps(CP_WSR_Stream->ParentStream, CP_WSR_Stream);
        CP_WSR_Stream->OldestUnreleasedTimestep = CP_WSR_Stream->LastSentTimestep + 1;
        for (int i = 0; i < CP_WSR_Stream->ReaderCohortSize; i++)
        {
            if (CP_WSR_Stream->Connections[i].CMconn)
            {
                CMConnection_dereference(CP_WSR_Stream->Connections[i].CMconn);
                CP_WSR_Stream->Connections[i].CMconn = NULL;
            }
        }
        if (NewState == PeerFailed)
        {
            // move to fully closed state later
            CMfree(CMadd_delayed_task(ParentStream->CPInfo->SharedCM->cm, 2, 0, CloseWSRStream,
                                      CP_WSR_Stream));
        }
        else
        {
            if (strncmp("mpi", ParentStream->ConfigParams->DataTransport, 3) == 0 &&
                CP_WSR_Stream->DP_WSR_Stream)
            {
                CP_WSR_Stream->ParentStream->DP_Interface->destroyWriterPerReader(
                    &Svcs, CP_WSR_Stream->DP_WSR_Stream);
                CP_WSR_Stream->DP_WSR_Stream = NULL;
            }
        }
    }
    CP_verbose(ParentStream, PerStepVerbose, "Moving Reader stream %p to status %s\n",
               (void *)CP_WSR_Stream, SSTStreamStatusStr[NewState]);

    QueueMaintenance(ParentStream);
}